

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RichHdrWrapper.cpp
# Opt level: O0

bufsize_t __thiscall RichHdrWrapper::getSize(RichHdrWrapper *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 local_38 [8];
  RICH_SIGNATURE rich1;
  offset_t diff;
  offset_t richOffset;
  offset_t dansOffset;
  RichHdrWrapper *this_local;
  
  if ((this->richSign == (RICH_SIGNATURE *)0x0) || (this->dansHdr == (RICH_DANS_HEADER *)0x0)) {
    this_local = (RichHdrWrapper *)0x0;
  }
  else {
    iVar1 = (*(this->super_PEElementWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[6])(this,this->dansHdr,0);
    iVar2 = (*(this->super_PEElementWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[6])(this,this->richSign,0);
    rich1 = (RICH_SIGNATURE)(CONCAT44(extraout_var_00,iVar2) - CONCAT44(extraout_var,iVar1));
    memset(local_38,0,8);
    this_local = (RichHdrWrapper *)((long)rich1 + 8);
  }
  return (bufsize_t)this_local;
}

Assistant:

bufsize_t RichHdrWrapper::getSize()
{
    if (!this->richSign || !this->dansHdr) {
        return 0;
    }
    const offset_t dansOffset = getOffset(this->dansHdr);
    const offset_t richOffset = getOffset(this->richSign);
    offset_t diff = richOffset - dansOffset;

    pe::RICH_SIGNATURE rich1 = { 0 };
    diff += sizeof(rich1);
    return diff;
}